

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# benchmark.cc
# Opt level: O1

Benchmark * __thiscall
benchmark::internal::Benchmark::Args(Benchmark *this,vector<int,_std::allocator<int>_> *args)

{
  pointer pvVar1;
  pointer pvVar2;
  int iVar3;
  CheckHandler CStack_18;
  
  pvVar1 = (this->imp_->args_).
           super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pvVar2 = (this->imp_->args_).
           super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if ((pvVar1 != pvVar2) &&
     ((int)((ulong)~((long)(pvVar1->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                           super__Vector_impl_data._M_finish -
                    (long)(pvVar1->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                          super__Vector_impl_data._M_start) >> 2) != 0)) {
    if (pvVar1 == pvVar2) {
      iVar3 = -1;
    }
    else {
      iVar3 = (int)((ulong)((long)(pvVar1->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                                  super__Vector_impl_data._M_finish -
                           (long)(pvVar1->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                                 super__Vector_impl_data._M_start) >> 2);
    }
    if (iVar3 != (int)((ulong)((long)(args->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                                     super__Vector_impl_data._M_finish -
                              (long)(args->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                                    super__Vector_impl_data._M_start) >> 2)) {
      CheckHandler::CheckHandler
                (&CStack_18,
                 "imp_->ArgsCnt() == -1 || imp_->ArgsCnt() == static_cast<int>(args.size())",
                 "/workspace/llm4binary/github/license_c_cmakelists/jtomschroeder[P]lambda/vendor/benchmark/src/benchmark.cc"
                 ,"Args",0x2c0);
      CheckHandler::~CheckHandler(&CStack_18);
    }
  }
  GetNullLogInstance();
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::push_back(&this->imp_->args_,args);
  return this;
}

Assistant:

Benchmark* Benchmark::Args(const std::vector<int>& args) {
  CHECK(imp_->ArgsCnt() == -1 || imp_->ArgsCnt() == static_cast<int>(args.size()));
  imp_->Args(args);
  return this;
}